

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O3

void __thiscall Rml::DataViewValue::DataViewValue(DataViewValue *this,Element *element)

{
  String local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"value","");
  DataViewAttribute::DataViewAttribute(&this->super_DataViewAttribute,element,&local_40,100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_DataViewAttribute).super_DataViewCommon.super_DataView.super_Releasable.
  _vptr_Releasable = (_func_int **)&PTR__DataViewCommon_0032ea70;
  return;
}

Assistant:

DataViewValue::DataViewValue(Element* element) : DataViewAttribute(element, "value", SortOffset_DataValue) {}